

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O2

void CalcExpression(void)

{
  optype optor;
  tokentype tokopnd;
  int tabindex;
  tokentype tokopnd_00;
  addressrec aVar1;
  addressrec op3;
  
  tokopnd = actionpop();
  tabindex = actionpop();
  tokopnd_00 = actionpop();
  if (tabindex == 0x16) {
    optor = opadd;
  }
  else {
    if (tabindex != 0x17) {
      printlexeme(tabindex);
      error(" is an invalid operator",linenum);
    }
    optor = opsub;
  }
  aVar1 = getaddress(tokopnd_00);
  op3 = getaddress(tokopnd);
  aVar1 = GenArithQuad(aVar1,optor,op3);
  actionpush(aVar1.opnd);
  didcalculation = 1;
  return;
}

Assistant:

void	CalcExpression(void)
{
    enum tokentype		tokoptor, tokopnd1, tokopnd2;
    enum optype		optor = opnull;
    struct addressrec	op1, op2, op3;
    
    tokopnd2 = actionpop();
    tokoptor = actionpop();
    tokopnd1 = actionpop();
    
    switch(tokoptor)	{
        case tokplus:		optor = opadd; break;
        case tokminus:	optor = opsub;	break;
        default:	printlexeme(tokoptor);
            error(" is an invalid operator", linenum);
    }
    
    op2 = getaddress(tokopnd1);
    op3 = getaddress(tokopnd2);
    
    op1 = GenArithQuad(op2, optor, op3);
    actionpush(op1.opnd);
    
    didcalculation = YES;
}